

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
ElementsAreMatcherImpl<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>
::
ElementsAreMatcherImpl<__gnu_cxx::__normal_iterator<std::pair<int,int>const*,std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>>
          (ElementsAreMatcherImpl<phmap::btree_map<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>>const&>
           *this,__normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                 first,
          __normal_iterator<const_std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          last)

{
  MatcherBase<const_std::pair<const_int,_int>_&> MStack_38;
  
  *(undefined ***)this = &PTR__ElementsAreMatcherImpl_004b3548;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  *(undefined8 *)(this + 0x18) = 0;
  for (; first._M_current != last._M_current; first._M_current = first._M_current + 1) {
    MatcherCastImpl<const_std::pair<const_int,_int>_&,_std::pair<int,_int>_>::CastImpl
              (&MStack_38,first._M_current);
    std::
    vector<testing::Matcher<std::pair<int_const,int>const&>,std::allocator<testing::Matcher<std::pair<int_const,int>const&>>>
    ::emplace_back<testing::Matcher<std::pair<int_const,int>const&>>
              ((vector<testing::Matcher<std::pair<int_const,int>const&>,std::allocator<testing::Matcher<std::pair<int_const,int>const&>>>
                *)(this + 8),(Matcher<const_std::pair<const_int,_int>_&> *)&MStack_38);
    MatcherBase<const_std::pair<const_int,_int>_&>::~MatcherBase(&MStack_38);
  }
  return;
}

Assistant:

ElementsAreMatcherImpl(InputIter first, InputIter last) {
    while (first != last) {
      matchers_.push_back(MatcherCast<const Element&>(*first++));
    }
  }